

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O2

int dom_trans_func(gen_ctx_t gen_ctx,bb_t_conflict bb)

{
  int iVar1;
  
  bitmap_clear(gen_ctx->temp_bitmap);
  bitmap_set_bit_p(gen_ctx->temp_bitmap,bb->index);
  iVar1 = bitmap_ior(bb->dom_out,bb->dom_in,gen_ctx->temp_bitmap);
  return iVar1;
}

Assistant:

static int dom_trans_func (gen_ctx_t gen_ctx, bb_t bb) {
  bitmap_clear (temp_bitmap);
  bitmap_set_bit_p (temp_bitmap, bb->index);
  return bitmap_ior (bb->dom_out, bb->dom_in, temp_bitmap);
}